

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O3

TonkFile tonk_file_from_disk(TonkConnection connection,uint32_t channel,char *name,char *filepath)

{
  TonkFile pTVar1;
  
  if (fp_tonk_file_from_disk != (fp_tonk_file_from_disk_t)0x0) {
    pTVar1 = (*fp_tonk_file_from_disk)(connection,channel,name,filepath);
    return pTVar1;
  }
  return (TonkFile)0x0;
}

Assistant:

TonkFile tonk_file_from_disk(
    TonkConnection connection,  ///< Connection to send on
    uint32_t          channel,  ///< Reliable channel for data
    const char*          name,  ///< Transfer name
    const char*      filepath   ///< Path for file to send
)
{
    if (!fp_tonk_file_from_disk) {
        return 0;
    }

    return fp_tonk_file_from_disk(
        connection,
        channel,
        name,
        filepath);
}